

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# weighted_digraph_algorithm.h
# Opt level: O0

void __thiscall
my_algorithm::WeightedDigraphSPAcyclic<int,_int>::_dfs
          (WeightedDigraphSPAcyclic<int,_int> *this,Node *vertex)

{
  bool bVar1;
  __normal_iterator<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_**,_std::vector<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*,_std::allocator<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*>_>_>
  local_70;
  const_iterator local_68;
  reference local_60;
  WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>
  *edge;
  iterator __end0;
  iterator __begin0;
  vector<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>,_std::allocator<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
  *__range2;
  undefined1 local_30 [8];
  vector<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>,_std::allocator<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
  edges;
  Node *vertex_local;
  WeightedDigraphSPAcyclic<int,_int> *this_local;
  
  edges.
  super__Vector_base<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>,_std::allocator<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)vertex;
  data_structures::WeightedGraphAdjSet<int,_int>::adjEdges
            ((vector<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>,_std::allocator<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
              *)local_30,&(vertex->element).value);
  std::
  vector<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*,_std::allocator<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*>_>
  ::push_back(&this->_marked_nodes,
              (value_type *)
              &edges.
               super__Vector_base<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>,_std::allocator<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  __end0 = std::
           vector<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>,_std::allocator<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
           ::begin((vector<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>,_std::allocator<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
                    *)local_30);
  edge = (WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>
          *)std::
            vector<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>,_std::allocator<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
            ::end((vector<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>,_std::allocator<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
                   *)local_30);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end0,(__normal_iterator<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_*,_std::vector<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>,_std::allocator<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>_>
                                     *)&edge), bVar1) {
    local_60 = __gnu_cxx::
               __normal_iterator<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_*,_std::vector<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>,_std::allocator<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>_>
               ::operator*(&__end0);
    bVar1 = isInVector<data_structures::RBTreeNode<data_structures::TreeElement<int,data_structures::WeightedGraphAdjSet<int,int>>>*>
                      (&this->_marked_nodes,&local_60->to);
    if (!bVar1) {
      _dfs(this,local_60->to);
    }
    __gnu_cxx::
    __normal_iterator<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_*,_std::vector<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>,_std::allocator<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>_>
    ::operator++(&__end0);
  }
  local_70._M_current =
       (RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
        **)std::
           vector<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*,_std::allocator<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*>_>
           ::begin(&this->_reserve_post_nodes);
  __gnu_cxx::
  __normal_iterator<data_structures::RBTreeNode<data_structures::TreeElement<int,data_structures::WeightedGraphAdjSet<int,int>>>*const*,std::vector<data_structures::RBTreeNode<data_structures::TreeElement<int,data_structures::WeightedGraphAdjSet<int,int>>>*,std::allocator<data_structures::RBTreeNode<data_structures::TreeElement<int,data_structures::WeightedGraphAdjSet<int,int>>>*>>>
  ::
  __normal_iterator<data_structures::RBTreeNode<data_structures::TreeElement<int,data_structures::WeightedGraphAdjSet<int,int>>>**>
            ((__normal_iterator<data_structures::RBTreeNode<data_structures::TreeElement<int,data_structures::WeightedGraphAdjSet<int,int>>>*const*,std::vector<data_structures::RBTreeNode<data_structures::TreeElement<int,data_structures::WeightedGraphAdjSet<int,int>>>*,std::allocator<data_structures::RBTreeNode<data_structures::TreeElement<int,data_structures::WeightedGraphAdjSet<int,int>>>*>>>
              *)&local_68,&local_70);
  std::
  vector<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*,_std::allocator<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*>_>
  ::insert(&this->_reserve_post_nodes,local_68,
           (value_type *)
           &edges.
            super__Vector_base<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>,_std::allocator<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>,_std::allocator<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
  ::~vector((vector<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>,_std::allocator<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
             *)local_30);
  return;
}

Assistant:

void _dfs(Node* vertex) {
            auto edges = vertex->element.value.adjEdges();
            _marked_nodes.push_back(vertex);
            for (auto &edge: edges) {
                if (isInVector<Node*>(_marked_nodes, edge.to)) {
                    continue;
                }
                _dfs(edge.to);
            }
            _reserve_post_nodes.insert(_reserve_post_nodes.begin(), vertex);
        }